

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aho-corasick-lite.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  _Rb_tree_header *p_Var1;
  char *__s;
  size_t sVar2;
  clock_t cVar3;
  clock_t cVar4;
  ostream *poVar5;
  Trie trie;
  Trie local_58;
  
  if (argc < 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"usage ",6);
    __s = *argv;
    if (__s == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x10c0e0);
    }
    else {
      sVar2 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," dictfilePath textfilePath",0x1a);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
    std::ostream::put(-0x20);
    std::ostream::flush();
  }
  else {
    local_58.lengthVect.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.lengthVect.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_58.weightVect.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_58.lengthVect.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.weightVect.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.weightVect.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.root = (trie_node_t *)operator_new(0x40);
    p_Var1 = &((local_58.root)->nextMap)._M_t._M_impl.super__Rb_tree_header;
    ((local_58.root)->nextMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    ((local_58.root)->nextMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    ((local_58.root)->nextMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &p_Var1->_M_header;
    ((local_58.root)->nextMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         &p_Var1->_M_header;
    ((local_58.root)->nextMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    (local_58.root)->search_clue = (trie_node_t *)0x0;
    (local_58.root)->infoIndex = -1;
    local_58.size = 0;
    cVar3 = clock();
    Trie::loadDict(&local_58,argv[1]);
    cVar4 = clock();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," success in loadDict in ",0x18);
    poVar5 = std::ostream::_M_insert<double>((double)(cVar4 - cVar3) / 1000000.0);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," insert ",8);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," words",6);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"begin build clue",0x10);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
    std::ostream::put(-0x20);
    std::ostream::flush();
    cVar3 = clock();
    Trie::buildClue(&local_58);
    cVar4 = clock();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," success in build clue in ",0x1a);
    poVar5 = std::ostream::_M_insert<double>((double)(cVar4 - cVar3) / 1000000.0);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    cVar3 = clock();
    Trie::matchTextFile(&local_58,argv[2]);
    cVar4 = clock();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," success in matchFile in ",0x19);
    poVar5 = std::ostream::_M_insert<double>((double)(cVar4 - cVar3) / 1000000.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," total Null nodes : ",0x14);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    getchar();
    if (local_58.lengthVect.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.lengthVect.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_58.weightVect.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.weightVect.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
	if (argc < 3) {
	    cout << "usage " << argv[0] << " dictfilePath textfilePath" << endl;
	    return 0;
	}

	Trie trie;
	time_t time_s, time_e;
	time_s = clock();
	trie.loadDict(argv[1]);
	time_e = clock();
	cout << " success in loadDict in " << (double)(time_e - time_s)/CLOCKS_PER_SEC << endl;
	cout << " insert " << trie.getSize() << " words" << endl;

	cout << "begin build clue" << endl;
	time_s = clock();
	trie.buildClue();
	time_e = clock();
	cout << " success in build clue in " << (double)(time_e - time_s)/CLOCKS_PER_SEC << endl;

	int total = 0;

	time_s = clock();
    trie.matchTextFile(argv[2]);
    time_e = clock();
    cout << " success in matchFile in " << (double)(time_e - time_s)/CLOCKS_PER_SEC <<  " total Null nodes : " << endl;

    getchar();
	return 0;
}